

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioSop.c
# Opt level: O2

Vec_Int_t * Mio_SopCoverOr(Vec_Int_t *p,Vec_Int_t *q)

{
  int Entry;
  uint c;
  Vec_Int_t *p_00;
  int iVar1;
  
  p_00 = Vec_IntAlloc(q->nSize + p->nSize);
  for (iVar1 = 0; iVar1 < p->nSize; iVar1 = iVar1 + 1) {
    Entry = Vec_IntEntry(p,iVar1);
    Vec_IntPush(p_00,Entry);
  }
  for (iVar1 = 0; iVar1 < q->nSize; iVar1 = iVar1 + 1) {
    c = Vec_IntEntry(q,iVar1);
    Mio_SopPushSCC(p_00,c);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Mio_SopCoverOr( Vec_Int_t * p, Vec_Int_t * q )
{
    Vec_Int_t * r;
    unsigned Entry;
    int i;
    r = Vec_IntAlloc( Vec_IntSize(p) + Vec_IntSize(q) );
    Vec_IntForEachEntry( p, Entry, i )
        Vec_IntPush( r, Entry );
    Vec_IntForEachEntry( q, Entry, i )
        Mio_SopPushSCC( r, Entry );
    return r;
}